

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void N_VPrintFile_Serial(N_Vector x,FILE *outfile)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *x->content;
  if (0 < lVar1) {
    lVar2 = *(long *)((long)x->content + 0x10);
    lVar3 = 0;
    do {
      fprintf((FILE *)outfile,"%19.16e\n",*(undefined8 *)(lVar2 + lVar3 * 8));
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  fputc(10,(FILE *)outfile);
  return;
}

Assistant:

void N_VPrintFile_Serial(N_Vector x, FILE* outfile)
{
  sunindextype i, N;
  sunrealtype* xd;

  xd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i < N; i++)
  {
#if defined(SUNDIALS_EXTENDED_PRECISION)
    fprintf(outfile, "%35.32Le\n", xd[i]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    fprintf(outfile, "%19.16e\n", xd[i]);
#else
    fprintf(outfile, "%11.8e\n", xd[i]);
#endif
  }
  fprintf(outfile, "\n");

  return;
}